

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O1

void cmExecuteProcessCommandFixText
               (vector<char,_std::allocator<char>_> *output,bool strip_trailing_whitespace)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ulong in_RAX;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pcVar7;
  undefined8 uStack_28;
  
  pcVar7 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  uVar5 = (long)(output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar7;
  if (uVar5 == 0) {
    uVar6 = 0;
  }
  else {
    uVar4 = 0;
    uVar2 = 1;
    uVar6 = 0;
    do {
      cVar1 = pcVar7[uVar4];
      uVar4 = (ulong)uVar2;
      if ((cVar1 != '\0') && (((cVar1 != '\r' || (uVar5 <= uVar4)) || (pcVar7[uVar4] != '\n')))) {
        pcVar7[uVar6] = cVar1;
        uVar6 = (ulong)((int)uVar6 + 1);
      }
      pcVar7 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = (long)(output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar7;
      uVar2 = uVar2 + 1;
    } while (uVar4 < uVar5);
  }
  uStack_28 = in_RAX;
  if (strip_trailing_whitespace && (int)uVar6 != 0) {
    do {
      cVar1 = pcVar7[uVar6 - 1];
      iVar3 = isspace((int)cVar1);
      if (((iVar3 == 0) && (cVar1 != '\r')) && (cVar1 != '\n')) goto LAB_0023f02c;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    uVar6 = 0;
  }
LAB_0023f02c:
  std::vector<char,_std::allocator<char>_>::resize(output,uVar6 & 0xffffffff);
  uStack_28 = uStack_28 & 0xffffffffffffff;
  std::vector<char,_std::allocator<char>_>::emplace_back<char>
            (output,(char *)((long)&uStack_28 + 7));
  return;
}

Assistant:

void cmExecuteProcessCommandFixText(std::vector<char>& output,
                                    bool strip_trailing_whitespace)
{
  // Remove \0 characters and the \r part of \r\n pairs.
  unsigned int in_index = 0;
  unsigned int out_index = 0;
  while (in_index < output.size()) {
    char c = output[in_index++];
    if ((c != '\r' ||
         !(in_index < output.size() && output[in_index] == '\n')) &&
        c != '\0') {
      output[out_index++] = c;
    }
  }

  // Remove trailing whitespace if requested.
  if (strip_trailing_whitespace) {
    while (out_index > 0 &&
           cmExecuteProcessCommandIsWhitespace(output[out_index - 1])) {
      --out_index;
    }
  }

  // Shrink the vector to the size needed.
  output.resize(out_index);

  // Put a terminator on the text string.
  output.push_back('\0');
}